

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

bool fmt::v8::detail::check_char_specs<char8_t,fmt::v8::detail::error_handler>
               (basic_format_specs<char8_t> *specs,error_handler *eh)

{
  presentation_type type;
  bool bVar1;
  
  type = specs->type;
  if ((type == none) || (type == chr)) {
    if (((*(ushort *)&specs->field_0x9 & 0xf) == 4) ||
       (bVar1 = true, (*(ushort *)&specs->field_0x9 & 0xf0) != 0)) {
      fmt::v8::detail::throw_format_error("invalid format specifier for char");
    }
  }
  else {
    check_int_type_spec<fmt::v8::detail::error_handler&>(type,eh);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

FMT_CONSTEXPR auto check_char_specs(const basic_format_specs<Char>& specs,
                                    ErrorHandler&& eh = {}) -> bool {
  if (specs.type != presentation_type::none &&
      specs.type != presentation_type::chr) {
    check_int_type_spec(specs.type, eh);
    return false;
  }
  if (specs.align == align::numeric || specs.sign != sign::none || specs.alt)
    eh.on_error("invalid format specifier for char");
  return true;
}